

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx512_gemm.h
# Opt level: O3

void intgemm::AVX512BW::Kernels16::Quantize
               (float *input,int16_t *output,float quant_mult,Index size)

{
  long lVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 in_register_00001204 [60];
  
  auVar3._4_60_ = in_register_00001204;
  auVar3._0_4_ = quant_mult;
  if (size != 0) {
    auVar3 = vbroadcastss_avx512f(auVar3._0_16_);
    lVar1 = 0;
    do {
      auVar4 = vmulps_avx512f(auVar3,*(undefined1 (*) [64])((long)input + lVar1));
      auVar4 = vcvtps2dq_avx512f(auVar4);
      auVar2 = vpmovsdw_avx512f(auVar4);
      *(undefined1 (*) [32])output = auVar2;
      output = (int16_t *)((long)output + 0x20);
      lVar1 = lVar1 + 0x40;
    } while ((ulong)size << 2 != lVar1);
  }
  return;
}

Assistant:

INTGEMM_AVX512BW static void Quantize(const float *input, int16_t *output, float quant_mult, Index size) {
    assert(size % 16 == 0);
    assert(reinterpret_cast<uintptr_t>(input) % 64 == 0);
    // Fill with the quantization multiplier.
    const __m512 quant_mult_reg = _mm512_set1_ps(quant_mult);
    const float *end = input + size;
    for (; input != end; input += 16, output += 16) {
      // There doesn't seem to be an unmasked version.
      _mm512_mask_cvtsepi32_storeu_epi16(output, 0xffff, QuantizerGrab(input, quant_mult_reg));
    }
  }